

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddTwiceListedError
          (DescriptorBuilder *this,FileDescriptorProto *proto,int index)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FileDescriptorProto *descriptor;
  string *this_00;
  anon_class_16_2_b60459d3 local_50;
  VoidPtr local_40;
  Invoker<std::__cxx11::basic_string<char>_> local_38;
  string_view local_30;
  int local_1c;
  FileDescriptorProto *pFStack_18;
  int index_local;
  FileDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  local_1c = index;
  pFStack_18 = proto;
  proto_local = (FileDescriptorProto *)this;
  this_00 = FileDescriptorProto::dependency_abi_cxx11_(proto,index);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  descriptor = pFStack_18;
  local_50.proto = pFStack_18;
  local_50.index = &local_1c;
  absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
  FunctionRef<google::protobuf::DescriptorBuilder::AddTwiceListedError(google::protobuf::FileDescriptorProto_const&,int)::__0,void>
            ((FunctionRef<std::__cxx11::string()> *)&local_40,&local_50);
  make_error.invoker_ = local_38;
  make_error.ptr_.obj = local_40.obj;
  AddError(this,local_30,&descriptor->super_Message,IMPORT,make_error);
  return;
}

Assistant:

void DescriptorBuilder::AddTwiceListedError(const FileDescriptorProto& proto,
                                            int index) {
  AddError(proto.dependency(index), proto,
           DescriptorPool::ErrorCollector::IMPORT, [&] {
             return absl::StrCat("Import \"", proto.dependency(index),
                                 "\" was listed twice.");
           });
}